

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

bool __thiscall QMenuPrivate::mouseEventTaken(QMenuPrivate *this,QMouseEvent *e)

{
  short sVar1;
  short sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long lVar6;
  QWidgetData *this_00;
  Data *pDVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  QRect QVar11;
  QRect QVar12;
  char cVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined4 uVar21;
  ulong uVar22;
  QStyle *pQVar23;
  QObject *this_01;
  Data *pDVar24;
  long lVar25;
  QWidget *pQVar26;
  undefined8 uVar27;
  undefined4 in_ECX;
  uint uVar28;
  uint uVar29;
  QWidgetData *pQVar30;
  QWidget *pQVar31;
  ulong uVar32;
  Representation RVar33;
  long in_FS_OFFSET;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  bool local_134;
  undefined1 local_108 [16];
  QPointF local_f8;
  QMouseEvent new_e;
  Representation RStack_e4;
  QPoint QStack_e0;
  QPointF local_98;
  QPoint pos;
  QStyleOption opt;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetData **)&(this->super_QWidgetPrivate).field_0x8;
  pos = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  auVar44 = QEventPoint::globalPosition();
  auVar39._0_8_ =
       (double)((ulong)auVar44._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar44._8_8_;
  auVar39._8_8_ =
       (double)((ulong)auVar44._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar44._0_8_;
  auVar39 = minpd(_DAT_0066f5d0,auVar39);
  auVar44._8_8_ = -(ulong)(-2147483648.0 < auVar39._8_8_);
  auVar44._0_8_ = -(ulong)(-2147483648.0 < auVar39._0_8_);
  uVar28 = movmskpd(in_ECX,auVar44);
  uVar32 = (ulong)(uint)(int)auVar39._8_8_;
  uVar22 = (ulong)(uint)(int)auVar39._0_8_ << 0x20;
  if ((uVar28 & 1) == 0) {
    uVar22 = 0x8000000000000000;
  }
  if ((uVar28 & 2) == 0) {
    uVar32 = 0x80000000;
  }
  QStack_e0 = _new_e;
  _new_e = (int)(uVar32 | uVar22);
  RStack_e4.m_i = (int)((uVar32 | uVar22) >> 0x20);
  pos = QWidget::mapFromGlobal((QWidget *)this_00,(QPoint *)&new_e);
  pQVar23 = QWidget::style((QWidget *)this_00);
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,0,0);
  QStyleOption::initFrom(&opt,(QWidget *)this_00);
  iVar15 = (**(code **)(*(long *)pQVar23 + 0xe0))(pQVar23,0x1c,&opt,this_00);
  iVar16 = (**(code **)(*(long *)pQVar23 + 0xe0))(pQVar23,0x1d,&opt,this_00);
  pQVar30 = this_00;
  iVar17 = (**(code **)(*(long *)pQVar23 + 0xe0))(pQVar23,0x1e,&opt);
  uVar28 = (uint)pQVar30;
  if ((this->scroll != (QMenuScroller *)0x0) &&
     (((pDVar7 = (this->activeMenu).wp.d, pDVar7 == (Data *)0x0 || (*(int *)(pDVar7 + 4) == 0)) ||
      ((this->activeMenu).wp.value == (QObject *)0x0)))) {
    if ((pos.xp.m_i < 0) ||
       (pQVar30 = *(QWidgetData **)((long)&this_00->crect + 0xc),
       ((pQVar30->crect).x2.m_i - (pQVar30->crect).x1.m_i) + 1 <= pos.xp.m_i)) {
      uVar28 = (uint)pQVar30;
      bVar14 = false;
    }
    else {
      bVar14 = false;
      uVar29 = 1;
      do {
        if ((uVar29 & this->scroll->scrollFlags) != 0) {
          RVar33.m_i = pos.yp.m_i;
          if (uVar29 == 1) {
            pQVar31 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
            pQVar23 = QWidget::style(pQVar31);
            iVar18 = (**(code **)(*(long *)pQVar23 + 0xe0))(pQVar23,0x1b,0,pQVar31);
            uVar28 = (int)(this->super_QWidgetPrivate).topmargin + iVar16 + iVar17 + iVar18;
            bVar14 = RVar33.m_i <= (int)uVar28;
          }
          else {
            lVar25 = *(long *)&(this_00->crect).y2;
            iVar18 = *(int *)(lVar25 + 0x20);
            pQVar31 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
            iVar20 = *(int *)(lVar25 + 0x18);
            pQVar23 = QWidget::style(pQVar31);
            iVar19 = (**(code **)(*(long *)pQVar23 + 0xe0))(pQVar23,0x1b,0,pQVar31);
            uVar28 = -((int)(this->super_QWidgetPrivate).bottommargin + iVar20 + iVar16 + iVar17 +
                      iVar19);
            bVar14 = (int)(iVar18 + uVar28 + 1) <= RVar33.m_i;
          }
          pQVar30 = (QWidgetData *)(ulong)uVar28;
          if (bVar14) {
            this->scroll->scrollDirection = (quint8)uVar29;
            break;
          }
        }
        uVar28 = (uint)pQVar30;
        bVar34 = uVar29 < 2;
        uVar29 = uVar29 * 2;
      } while (bVar34);
    }
    if (bVar14) {
      pQVar30 = this_00;
      QBasicTimer::start(&this->scroll->scrollTimer,50000000,1);
      uVar28 = (uint)pQVar30;
    }
    else {
      QBasicTimer::stop();
    }
    local_134 = true;
    if (bVar14) goto LAB_004612a2;
  }
  if ((this->field_0x421 & 2) != 0) {
    QStack_e0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    _new_e = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    sVar1 = (this->super_QWidgetPrivate).leftmargin;
    RVar33.m_i = iVar16 + iVar17 + (int)(this->super_QWidgetPrivate).topmargin;
    lVar25 = *(long *)&(this_00->crect).y2;
    sVar2 = (this->super_QWidgetPrivate).rightmargin;
    iVar16 = *(int *)(lVar25 + 0x1c);
    iVar18 = *(int *)(lVar25 + 0x14);
    pQVar23 = QWidget::style((QWidget *)this_00);
    pQVar30 = this_00;
    iVar20 = (**(code **)(*(long *)pQVar23 + 0xe0))(pQVar23,0x1f,&opt);
    uVar28 = (uint)pQVar30;
    RStack_e4.m_i = RVar33.m_i;
    _new_e = (int)sVar1 + iVar15 + iVar17;
    QStack_e0.xp.m_i = (iVar16 - (iVar15 + iVar17)) + (-iVar18 - (int)sVar2);
    QStack_e0.yp.m_i = iVar20 + RVar33.m_i + -1;
    if ((this->scroll != (QMenuScroller *)0x0) && ((this->scroll->scrollFlags & 1) != 0)) {
      pQVar31 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      pQVar23 = QWidget::style(pQVar31);
      iVar15 = (**(code **)(*(long *)pQVar23 + 0xe0))(pQVar23,0x1b,0);
      QVar11 = _new_e;
      uVar28 = (uint)pQVar31;
      RStack_e4.m_i = RStack_e4.m_i + iVar15;
      QVar12 = _new_e;
      QStack_e0.yp.m_i = (int)QVar11.y2.m_i;
      _new_e = QVar12._0_12_;
      QStack_e0.yp.m_i = QStack_e0.yp.m_i + iVar15;
    }
    QWidget::update((QWidget *)this_00,(QRect *)&new_e);
    cVar13 = QRect::contains((QPoint *)&new_e,SUB81(&pos,0));
    if (cVar13 != '\0') {
      auVar39 = QEventPoint::globalPosition();
      auVar35._0_8_ =
           (double)((ulong)auVar39._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar39._8_8_;
      auVar35._8_8_ =
           (double)((ulong)auVar39._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar39._0_8_;
      auVar39 = minpd(_DAT_0066f5d0,auVar35);
      auVar36._8_8_ = -(ulong)(-2147483648.0 < auVar39._8_8_);
      auVar36._0_8_ = -(ulong)(-2147483648.0 < auVar39._0_8_);
      uVar29 = movmskpd(uVar28,auVar36);
      uVar32 = (ulong)(uint)(int)auVar39._8_8_;
      uVar22 = (ulong)(uint)(int)auVar39._0_8_ << 0x20;
      if ((uVar29 & 1) == 0) {
        uVar22 = 0x8000000000000000;
      }
      uVar28 = 0x80000000;
      if ((uVar29 & 2) == 0) {
        uVar32 = 0x80000000;
      }
      local_98.xp = (qreal)(uVar32 | uVar22);
      bVar14 = hasMouseMoved(this,(QPoint *)&local_98);
      if (bVar14) {
        setCurrentAction(this,(QAction *)0x0,-1,SelectedFromElsewhere,false);
        this->field_0x421 = this->field_0x421 | 8;
        if (*(short *)(e + 8) == 3) {
          pDVar7 = (this->tornPopup).wp.d;
          if (((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) ||
             ((this->tornPopup).wp.value == (QObject *)0x0)) {
            this_01 = (QObject *)operator_new(0x28);
            QTornOffMenu::QTornOffMenu((QTornOffMenu *)this_01,(QMenu *)this_00);
            pDVar24 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(this_01);
            pDVar7 = (this->tornPopup).wp.d;
            (this->tornPopup).wp.d = pDVar24;
            (this->tornPopup).wp.value = this_01;
            if (pDVar7 != (Data *)0x0) {
              LOCK();
              *(int *)pDVar7 = *(int *)pDVar7 + -1;
              UNLOCK();
              if (*(int *)pDVar7 == 0) {
                operator_delete(pDVar7);
              }
            }
          }
          QWidget::setGeometry
                    ((QWidget *)(this->tornPopup).wp.value,
                     (QRect *)(*(long *)&(this_00->crect).y2 + 0x14));
          QWidget::show((QWidget *)(this->tornPopup).wp.value);
          hideUpToMenuBar(this);
        }
        local_134 = true;
        goto LAB_004612a2;
      }
    }
    this->field_0x421 = this->field_0x421 & 0xf7;
  }
  _new_e = QWidget::frameGeometry((QWidget *)this_00);
  auVar39 = QEventPoint::globalPosition();
  auVar37._0_8_ =
       (double)((ulong)auVar39._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar39._8_8_;
  auVar37._8_8_ =
       (double)((ulong)auVar39._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar39._0_8_;
  auVar39 = minpd(_DAT_0066f5d0,auVar37);
  auVar38._8_8_ = -(ulong)(-2147483648.0 < auVar39._8_8_);
  auVar38._0_8_ = -(ulong)(-2147483648.0 < auVar39._0_8_);
  uVar28 = movmskpd(uVar28,auVar38);
  uVar32 = (ulong)(uint)(int)auVar39._8_8_;
  uVar22 = (ulong)(uint)(int)auVar39._0_8_ << 0x20;
  if ((uVar28 & 1) == 0) {
    uVar22 = 0x8000000000000000;
  }
  if ((uVar28 & 2) == 0) {
    uVar32 = 0x80000000;
  }
  local_98.xp = (qreal)(uVar32 | uVar22);
  local_134 = false;
  cVar13 = QRect::contains((QPoint *)&new_e,SUB81(&local_98,0));
  if (cVar13 == '\0') {
    pDVar7 = (this->causedPopup).widget.wp.d;
    if ((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) {
      pQVar31 = (QWidget *)0x0;
    }
    else {
      pQVar31 = (QWidget *)(this->causedPopup).widget.wp.value;
    }
    do {
      local_134 = pQVar31 != (QWidget *)0x0;
      if (pQVar31 == (QWidget *)0x0) break;
      local_98.yp._0_4_ = 0xffffffff;
      local_98.xp = -NAN;
      local_98.yp._4_4_ = 0xffffffff;
      _new_e = (QRect)QEventPoint::globalPosition();
      local_98 = QWidget::mapFromGlobal(pQVar31,(QPointF *)&new_e);
      lVar25 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
      if (lVar25 == 0) {
        lVar25 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if (lVar25 == 0) {
          cVar13 = '\0';
          goto LAB_00461421;
        }
        lVar8 = *(long *)(lVar25 + 0x20);
        auVar10._4_4_ = *(int *)(lVar8 + 0x20) - *(int *)(lVar8 + 0x18);
        auVar10._0_4_ = *(int *)(lVar8 + 0x1c) - *(int *)(lVar8 + 0x14);
        auVar10._8_8_ = 0;
        _new_e = (QRect)(auVar10 << 0x40);
        auVar42._0_8_ =
             (double)((ulong)local_98.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_98.xp;
        auVar42._8_8_ =
             (double)((ulong)local_98.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_98.yp;
        auVar39 = minpd(_DAT_0066f5d0,auVar42);
        auVar43._8_8_ = -(ulong)(-2147483648.0 < auVar39._8_8_);
        auVar43._0_8_ = -(ulong)(-2147483648.0 < auVar39._0_8_);
        uVar28 = movmskpd((int)lVar8,auVar43);
        uVar22 = (ulong)(uint)(int)auVar39._0_8_;
        uVar32 = (ulong)(uint)(int)auVar39._8_8_ << 0x20;
        if ((uVar28 & 2) == 0) {
          uVar32 = 0x8000000000000000;
        }
        if ((uVar28 & 1) == 0) {
          uVar22 = 0x80000000;
        }
        local_f8.xp = (qreal)(uVar22 | uVar32);
        cVar13 = QRect::contains((QPoint *)&new_e,SUB81(&local_f8,0));
        lVar8 = *(long *)(*(long *)(lVar25 + 8) + 0x2f8);
        if ((lVar8 == 0) || (*(int *)(lVar8 + 4) == 0)) goto LAB_00461421;
        pQVar26 = *(QWidget **)(*(long *)(lVar25 + 8) + 0x300);
      }
      else {
        lVar25 = *(long *)(lVar25 + 0x20);
        auVar9._4_4_ = *(int *)(lVar25 + 0x20) - *(int *)(lVar25 + 0x18);
        auVar9._0_4_ = *(int *)(lVar25 + 0x1c) - *(int *)(lVar25 + 0x14);
        auVar9._8_8_ = 0;
        _new_e = (QRect)(auVar9 << 0x40);
        auVar40._0_8_ =
             (double)((ulong)local_98.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_98.xp;
        auVar40._8_8_ =
             (double)((ulong)local_98.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_98.yp;
        auVar39 = minpd(_DAT_0066f5d0,auVar40);
        auVar41._8_8_ = -(ulong)(-2147483648.0 < auVar39._8_8_);
        auVar41._0_8_ = -(ulong)(-2147483648.0 < auVar39._0_8_);
        uVar28 = movmskpd((int)lVar25,auVar41);
        uVar22 = (ulong)(uint)(int)auVar39._0_8_;
        uVar32 = (ulong)(uint)(int)auVar39._8_8_ << 0x20;
        if ((uVar28 & 2) == 0) {
          uVar32 = 0x8000000000000000;
        }
        if ((uVar28 & 1) == 0) {
          uVar22 = 0x80000000;
        }
        local_f8.xp = (qreal)(uVar22 | uVar32);
        cVar13 = QRect::contains((QPoint *)&new_e,SUB81(&local_f8,0));
LAB_00461421:
        pQVar26 = (QWidget *)0x0;
      }
      if ((cVar13 == '\0') ||
         ((sVar1 = *(short *)(e + 8), sVar1 == 3 && (&mouseDown->super_QWidget != pQVar31)))) {
        bVar14 = true;
        if (pQVar26 == (QWidget *)0x0) {
          QMenuSloppyState::leave(&this->sloppyState);
        }
      }
      else {
        QStack_e0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        _new_e = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        pQVar26 = QWidget::window(pQVar31);
        local_f8 = QWidget::mapTo(pQVar31,pQVar26,&local_98);
        auVar39 = QEventPoint::globalPosition();
        uVar3 = *(undefined4 *)(e + 0x20);
        uVar4 = *(undefined4 *)(e + 0x40);
        uVar5 = *(undefined4 *)(e + 0x44);
        local_108 = auVar39;
        uVar21 = QMouseEvent::source();
        uVar27 = QPointerEvent::pointingDevice();
        QMouseEvent::QMouseEvent
                  (&new_e,sVar1,&local_98,&local_f8,local_108,uVar4,uVar5,uVar3,uVar21,uVar27);
        QCoreApplication::sendEvent(&pQVar31->super_QObject,(QEvent *)&new_e);
        QMouseEvent::~QMouseEvent(&new_e);
        bVar14 = false;
        pQVar26 = pQVar31;
      }
      pQVar31 = pQVar26;
    } while (bVar14);
  }
LAB_004612a2:
  QStyleOption::~QStyleOption(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return local_134;
}

Assistant:

bool QMenuPrivate::mouseEventTaken(QMouseEvent *e)
{
    Q_Q(QMenu);
    QPoint pos = q->mapFromGlobal(e->globalPosition().toPoint());

    QStyle *style = q->style();
    QStyleOption opt(0);
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q);
    const int vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);

    if (scroll && !activeMenu) { //let the scroller "steal" the event
        bool isScroll = false;
        if (pos.x() >= 0 && pos.x() < q->width()) {
        for (int dir = QMenuScroller::ScrollUp; dir <= QMenuScroller::ScrollDown; dir = dir << 1) {
                if (scroll->scrollFlags & dir) {
                    if (dir == QMenuScroller::ScrollUp)
                        isScroll = (pos.y() <= scrollerHeight() + fw + vmargin + topmargin);
                    else if (dir == QMenuScroller::ScrollDown)
                        isScroll = (pos.y() >= q->height() - scrollerHeight() - fw - vmargin - bottommargin);
                    if (isScroll) {
                        scroll->scrollDirection = dir;
                        break;
                    }
                }
            }
        }
        if (isScroll) {
            scroll->scrollTimer.start(50, q);
            return true;
        } else {
            scroll->scrollTimer.stop();
        }
    }

    if (tearoff) { //let the tear off thingie "steal" the event..
        QRect tearRect(leftmargin + hmargin + fw, topmargin + vmargin + fw, q->width() - fw * 2 - hmargin * 2 -leftmargin - rightmargin,
                       q->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, &opt, q));
        if (scroll && scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            tearRect.translate(0, scrollerHeight());
        q->update(tearRect);
        if (tearRect.contains(pos) && hasMouseMoved(e->globalPosition().toPoint())) {
            setCurrentAction(nullptr);
            tearoffHighlighted = 1;
            if (e->type() == QEvent::MouseButtonRelease) {
                if (!tornPopup)
                    tornPopup = new QTornOffMenu(q);
                tornPopup->setGeometry(q->geometry());
                tornPopup->show();
                hideUpToMenuBar();
            }
            return true;
        }
        tearoffHighlighted = 0;
    }

    if (q->frameGeometry().contains(e->globalPosition().toPoint()))
        return false; //otherwise if the event is in our rect we want it..

    for(QWidget *caused = causedPopup.widget; caused;) {
        bool passOnEvent = false;
        QWidget *next_widget = nullptr;
        QPointF cpos = caused->mapFromGlobal(e->globalPosition());
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
            passOnEvent = mb->rect().contains(cpos.toPoint());
        } else
#endif
        if (QMenu *m = qobject_cast<QMenu*>(caused)) {
            passOnEvent = m->rect().contains(cpos.toPoint());
            next_widget = m->d_func()->causedPopup.widget;
        }
        if (passOnEvent) {
            if (e->type() != QEvent::MouseButtonRelease || mouseDown == caused) {
                QMouseEvent new_e(e->type(), cpos, caused->mapTo(caused->topLevelWidget(), cpos), e->globalPosition(),
                                  e->button(), e->buttons(), e->modifiers(),
                                  e->source(), e->pointingDevice());
                QCoreApplication::sendEvent(caused, &new_e);
                return true;
            }
        }
        caused = next_widget;
        if (!caused)
            sloppyState.leave(); // Start timers
    }
    return false;
}